

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

int hex2byte(uint8_t *dest,uint8_t *source)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  
  bVar1 = *source;
  bVar2 = bVar1 - 0x30;
  if (9 < bVar2) {
    if (0x25 < bVar1 - 0x41) {
      return -1;
    }
    if ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) == 0) {
      return -1;
    }
    bVar2 = bVar1 + 0xa9;
  }
  *dest = bVar2 << 4;
  bVar1 = source[1];
  bVar3 = bVar1 - 0x30;
  if (9 < bVar3) {
    if (0x25 < bVar1 - 0x41) {
      return -1;
    }
    if ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) == 0) {
      return -1;
    }
    bVar3 = (bVar1 | 0x20) + 0xa9;
  }
  *dest = bVar3 | bVar2 << 4;
  return 0;
}

Assistant:

static inline int hex2byte(uint8_t *dest, const uint8_t *source) {
  if (source[0] >= '0' && source[0] <= '9')
    *dest = (source[0] - '0');
  else if ((source[0] >= 'a' && source[0] <= 'f') ||
           (source[0] >= 'A' && source[0] <= 'F'))
    *dest = (source[0] | 32) - 87;
  else
    return -1;
  *dest <<= 4;
  if (source[1] >= '0' && source[1] <= '9')
    *dest |= (source[1] - '0');
  else if ((source[1] >= 'a' && source[1] <= 'f') ||
           (source[1] >= 'A' && source[1] <= 'F'))
    *dest |= (source[1] | 32) - 87;
  else
    return -1;
  return 0;
}